

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O2

ON_ClippingPlaneData * GetClippingPlaneData(uint sn)

{
  bool bVar1;
  ON_ClippingPlaneData *pOVar2;
  
  if (sn == 0) {
    pOVar2 = (ON_ClippingPlaneData *)0x0;
  }
  else {
    bVar1 = ON_SleepLock::GetLock(&g_data_list_lock);
    pOVar2 = ON_ClippingPlaneDataList::FromSerialNumber(&g_data_list,sn);
    if (bVar1) {
      ON_SleepLock::ReturnLock(&g_data_list_lock);
    }
  }
  return pOVar2;
}

Assistant:

static ON_ClippingPlaneData* GetClippingPlaneData(unsigned int sn)
{
  if (0==sn)
    return nullptr;
  
  bool bReturnLock = g_data_list_lock.GetLock();
  ON_ClippingPlaneData* rc = g_data_list.FromSerialNumber(sn);
  if(bReturnLock)
    g_data_list_lock.ReturnLock();
  return rc;
}